

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# util.cc
# Opt level: O2

void __thiscall kratos::string::trim(string *this,string *s)

{
  string *psVar1;
  bool bVar2;
  long lVar3;
  _Iter_pred<kratos::string::ltrim(std::__cxx11::string&)::_lambda(int)_1_> *__it;
  long lVar4;
  long lVar5;
  long lVar6;
  _Iter_pred<kratos::string::ltrim(std::__cxx11::string&)::_lambda(int)_1_> *p_Var7;
  _Iter_pred<kratos::string::ltrim(std::__cxx11::string&)::_lambda(int)_1_> *p_Var8;
  long lVar9;
  long local_78;
  long local_70;
  long local_68;
  long local_60;
  long local_58;
  long local_50;
  long local_48;
  string *local_40;
  _Iter_pred<kratos::string::ltrim(std::__cxx11::string&)::_lambda(int)_1_> *local_38;
  
  __it = *(_Iter_pred<kratos::string::ltrim(std::__cxx11::string&)::_lambda(int)_1_> **)this;
  lVar4 = *(long *)(this + 8);
  local_38 = __it + lVar4;
  p_Var7 = __it;
  local_40 = this;
  for (lVar6 = lVar4 >> 2; p_Var8 = p_Var7, 0 < lVar6; lVar6 = lVar6 + -1) {
    bVar2 = __gnu_cxx::__ops::
            _Iter_pred<kratos::string::ltrim(std::__cxx11::string&)::{lambda(int)#1}>::operator()
                      (p_Var7,(__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                               )s);
    if (bVar2) goto LAB_001b74bc;
    bVar2 = __gnu_cxx::__ops::
            _Iter_pred<kratos::string::ltrim(std::__cxx11::string&)::{lambda(int)#1}>::operator()
                      (p_Var7 + 1,
                       (__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        )s);
    p_Var8 = p_Var7 + 1;
    if (bVar2) goto LAB_001b74bc;
    bVar2 = __gnu_cxx::__ops::
            _Iter_pred<kratos::string::ltrim(std::__cxx11::string&)::{lambda(int)#1}>::operator()
                      (p_Var7 + 2,
                       (__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        )s);
    p_Var8 = p_Var7 + 2;
    if (bVar2) goto LAB_001b74bc;
    bVar2 = __gnu_cxx::__ops::
            _Iter_pred<kratos::string::ltrim(std::__cxx11::string&)::{lambda(int)#1}>::operator()
                      (p_Var7 + 3,
                       (__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        )s);
    p_Var8 = p_Var7 + 3;
    if (bVar2) goto LAB_001b74bc;
    p_Var7 = p_Var7 + 4;
    lVar4 = lVar4 + -4;
  }
  if (lVar4 == 1) {
LAB_001b74aa:
    bVar2 = __gnu_cxx::__ops::
            _Iter_pred<kratos::string::ltrim(std::__cxx11::string&)::{lambda(int)#1}>::operator()
                      (p_Var7,(__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                               )s);
    p_Var8 = local_38;
    if (bVar2) {
      p_Var8 = p_Var7;
    }
  }
  else if (lVar4 == 2) {
LAB_001b7490:
    bVar2 = __gnu_cxx::__ops::
            _Iter_pred<kratos::string::ltrim(std::__cxx11::string&)::{lambda(int)#1}>::operator()
                      (p_Var8,(__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                               )s);
    if (!bVar2) {
      p_Var7 = p_Var8 + 1;
      goto LAB_001b74aa;
    }
  }
  else {
    p_Var8 = local_38;
    if ((lVar4 == 3) &&
       (bVar2 = __gnu_cxx::__ops::
                _Iter_pred<kratos::string::ltrim(std::__cxx11::string&)::{lambda(int)#1}>::
                operator()(p_Var7,(__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                   )s), p_Var8 = p_Var7, !bVar2)) {
      p_Var8 = p_Var7 + 1;
      goto LAB_001b7490;
    }
  }
LAB_001b74bc:
  psVar1 = local_40;
  std::__cxx11::string::erase(local_40,__it,p_Var8);
  lVar4 = *(long *)psVar1;
  lVar6 = *(long *)(psVar1 + 8);
  local_38 = (_Iter_pred<kratos::string::ltrim(std::__cxx11::string&)::_lambda(int)_1_> *)
             (lVar4 + lVar6);
  for (lVar9 = lVar6 >> 2; p_Var7 = local_38, lVar5 = lVar4 + lVar6, lVar3 = lVar5, 0 < lVar9;
      lVar9 = lVar9 + -1) {
    local_60 = lVar5;
    bVar2 = __gnu_cxx::__ops::
            _Iter_pred<kratos::string::rtrim(std::__cxx11::string&)::{lambda(int)#1}>::operator()
                      ((_Iter_pred<kratos::string::rtrim(std::__cxx11::string&)::_lambda(int)_1_> *)
                       &local_60,
                       (reverse_iterator<__gnu_cxx::__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        *)__it);
    p_Var7 = local_38;
    if (bVar2) goto LAB_001b7573;
    lVar3 = lVar4 + lVar6 + -1;
    local_58 = lVar3;
    bVar2 = __gnu_cxx::__ops::
            _Iter_pred<kratos::string::rtrim(std::__cxx11::string&)::{lambda(int)#1}>::operator()
                      ((_Iter_pred<kratos::string::rtrim(std::__cxx11::string&)::_lambda(int)_1_> *)
                       &local_58,
                       (reverse_iterator<__gnu_cxx::__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        *)__it);
    p_Var7 = local_38;
    if (bVar2) goto LAB_001b7573;
    lVar3 = lVar4 + lVar6 + -2;
    local_50 = lVar3;
    bVar2 = __gnu_cxx::__ops::
            _Iter_pred<kratos::string::rtrim(std::__cxx11::string&)::{lambda(int)#1}>::operator()
                      ((_Iter_pred<kratos::string::rtrim(std::__cxx11::string&)::_lambda(int)_1_> *)
                       &local_50,
                       (reverse_iterator<__gnu_cxx::__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        *)__it);
    p_Var7 = local_38;
    if (bVar2) goto LAB_001b7573;
    lVar3 = lVar4 + lVar6 + -3;
    local_48 = lVar3;
    bVar2 = __gnu_cxx::__ops::
            _Iter_pred<kratos::string::rtrim(std::__cxx11::string&)::{lambda(int)#1}>::operator()
                      ((_Iter_pred<kratos::string::rtrim(std::__cxx11::string&)::_lambda(int)_1_> *)
                       &local_48,
                       (reverse_iterator<__gnu_cxx::__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        *)__it);
    p_Var7 = local_38;
    if (bVar2) goto LAB_001b7573;
    lVar6 = lVar6 + -4;
  }
  if (lVar6 == 3) {
    local_78 = lVar5;
    bVar2 = __gnu_cxx::__ops::
            _Iter_pred<kratos::string::rtrim(std::__cxx11::string&)::{lambda(int)#1}>::operator()
                      ((_Iter_pred<kratos::string::rtrim(std::__cxx11::string&)::_lambda(int)_1_> *)
                       &local_78,
                       (reverse_iterator<__gnu_cxx::__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        *)__it);
    if (bVar2) goto LAB_001b7573;
    lVar5 = lVar4 + 2;
LAB_001b75aa:
    local_70 = lVar5;
    bVar2 = __gnu_cxx::__ops::
            _Iter_pred<kratos::string::rtrim(std::__cxx11::string&)::{lambda(int)#1}>::operator()
                      ((_Iter_pred<kratos::string::rtrim(std::__cxx11::string&)::_lambda(int)_1_> *)
                       &local_70,
                       (reverse_iterator<__gnu_cxx::__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        *)__it);
    lVar3 = lVar5;
    if (bVar2) goto LAB_001b7573;
    lVar5 = lVar5 + -1;
  }
  else {
    if (lVar6 == 2) goto LAB_001b75aa;
    lVar3 = lVar4;
    if (lVar6 != 1) goto LAB_001b7573;
  }
  local_68 = lVar5;
  bVar2 = __gnu_cxx::__ops::
          _Iter_pred<kratos::string::rtrim(std::__cxx11::string&)::{lambda(int)#1}>::operator()
                    ((_Iter_pred<kratos::string::rtrim(std::__cxx11::string&)::_lambda(int)_1_> *)
                     &local_68,
                     (reverse_iterator<__gnu_cxx::__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)__it);
  lVar3 = lVar4;
  if (bVar2) {
    lVar3 = lVar5;
  }
LAB_001b7573:
  std::__cxx11::string::erase(local_40,lVar3,p_Var7);
  return;
}

Assistant:

void trim(std::string &s) {
    ltrim(s);
    rtrim(s);
}